

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Operation<duckdb::hugeint_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::hugeint_t,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (ArgMinMaxState<duckdb::hugeint_t,_duckdb::string_t> *state,hugeint_t *x,string_t *y,
               AggregateBinaryInput *binary)

{
  string_t y_data;
  hugeint_t x_data;
  ArgMinMaxState<duckdb::hugeint_t,_duckdb::string_t> *in_RCX;
  TemplatedValidityMask<unsigned_long> *in_RDX;
  int64_t *in_RSI;
  byte *in_RDI;
  AggregateBinaryInput *in_stack_ffffffffffffffa8;
  ArgMinMaxState<duckdb::hugeint_t,_duckdb::string_t> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffcf;
  string_t *in_stack_ffffffffffffffd0;
  hugeint_t *in_stack_ffffffffffffffd8;
  
  if ((*in_RDI & 1) == 0) {
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_RDX,(idx_t)in_RSI);
    Assign<duckdb::hugeint_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::hugeint_t,duckdb::string_t>>
              (in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               (bool)in_stack_ffffffffffffffcf);
    *in_RDI = 1;
  }
  else {
    x_data.upper = *in_RSI;
    x_data.lower = (uint64_t)
                   (in_RDX->validity_data).internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
    y_data.value.pointer.ptr = (char *)in_RDX->validity_mask;
    y_data.value._0_8_ = in_stack_ffffffffffffffb8;
    Execute<duckdb::hugeint_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::hugeint_t,duckdb::string_t>>
              (in_stack_ffffffffffffffb0,x_data,y_data,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}